

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::ImageLookup
          (PortalImageInfiniteLight *this,Point2f uv,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  Float *pFVar2;
  int c;
  int c_00;
  Float FVar3;
  float fVar4;
  float fVar8;
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  undefined1 auVar9 [56];
  undefined1 auVar11 [56];
  SampledSpectrum SVar12;
  RGBIlluminantSpectrum spec;
  Float local_94;
  Float local_90;
  Float local_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  SampledWavelengths *local_70;
  undefined1 local_68 [16];
  RGB local_58;
  RGBIlluminantSpectrum local_48;
  undefined1 auVar7 [64];
  undefined1 auVar5 [16];
  undefined1 auVar10 [64];
  
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  c_00 = 0;
  local_8c = 0.0;
  local_94 = 0.0;
  local_90 = 0.0;
  _local_88 = auVar6._0_16_;
  local_68 = vmovshdup_avx(_local_88);
  local_70 = lambda;
  do {
    lambda = (SampledWavelengths *)
             (CONCAT44(SUB84(lambda,4),
                       (int)((float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x *
                            (float)local_88._0_4_)) |
             (ulong)(uint)(int)((float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y *
                               (float)local_68._0_4_) << 0x20);
    FVar3 = Image::GetChannel(&this->image,(Point2i)lambda,c_00,(WrapMode2D)0x200000002);
    pFVar2 = &local_8c;
    if ((c_00 != 0) && (pFVar2 = &local_90, c_00 == 1)) {
      pFVar2 = &local_94;
    }
    *pFVar2 = FVar3;
    c_00 = c_00 + 1;
  } while (c_00 != 3);
  auVar5 = vinsertps_avx(ZEXT416((uint)local_8c),ZEXT416((uint)local_94),0x10);
  auVar5 = vmaxps_avx(auVar5,ZEXT816(0) << 0x40);
  auVar1 = vmaxss_avx(ZEXT416((uint)local_90),ZEXT816(0) << 0x40);
  auVar11 = ZEXT856(auVar1._8_8_);
  local_58._0_8_ = vmovlps_avx(auVar5);
  local_58.b = auVar1._0_4_;
  RGBIlluminantSpectrum::RGBIlluminantSpectrum(&local_48,this->imageColorSpace,&local_58);
  FVar3 = this->scale;
  local_88._4_4_ = FVar3;
  local_88._0_4_ = FVar3;
  fStack_80 = FVar3;
  fStack_7c = FVar3;
  auVar9 = ZEXT856(local_88._8_8_);
  SVar12 = RGBIlluminantSpectrum::Sample(&local_48,local_70);
  auVar10._0_8_ = SVar12.values.values._8_8_;
  auVar10._8_56_ = auVar11;
  auVar7._0_8_ = SVar12.values.values._0_8_;
  auVar7._8_56_ = auVar9;
  auVar5 = vmovlhps_avx(auVar7._0_16_,auVar10._0_16_);
  fVar4 = auVar5._0_4_ * (float)local_88._0_4_;
  fVar8 = auVar5._4_4_ * (float)local_88._4_4_;
  auVar5 = CONCAT412(auVar5._12_4_ * fStack_7c,
                     CONCAT48(auVar5._8_4_ * fStack_80,CONCAT44(fVar8,fVar4)));
  auVar5 = vshufpd_avx(auVar5,auVar5,1);
  SVar12.values.values._8_8_ = auVar5._0_8_;
  SVar12.values.values[0] = fVar4;
  SVar12.values.values[1] = fVar8;
  return (SampledSpectrum)SVar12.values.values;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::ImageLookup(
    Point2f uv, const SampledWavelengths &lambda) const {
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(uv, c);
    RGBIlluminantSpectrum spec(*imageColorSpace, ClampZero(rgb));
    return scale * spec.Sample(lambda);
}